

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::XmlReporter(XmlReporter *this,ContextOptions *co)

{
  ContextOptions *co_local;
  XmlReporter *this_local;
  
  IReporter::IReporter(&this->super_IReporter);
  (this->super_IReporter)._vptr_IReporter = (_func_int **)&PTR_report_query_0014aa48;
  XmlWriter::XmlWriter(&this->xml,co->cout);
  std::mutex::mutex(&this->mutex);
  this->opt = co;
  this->tc = (TestCaseData *)0x0;
  return;
}

Assistant:

XmlReporter(const ContextOptions& co)
                : xml(*co.cout)
                , opt(co) {}